

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O3

TestCaseGroup * vkt::SpirVAssembly::createOpSourceContinuedTests(TestContext *testCtx)

{
  ulong *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  TestCaseGroup *this;
  undefined8 *puVar4;
  long *plVar5;
  mapped_type *pmVar6;
  size_type *psVar7;
  size_t num4ByteChars;
  undefined8 uVar8;
  long lVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  NameCodePair *name;
  key_type local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string opsource;
  string local_198;
  RGBA defaultColors [4];
  NameCodePair tests [4];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragments;
  
  defaultColors[0].m_value = 0;
  defaultColors[1].m_value = 0;
  defaultColors[2].m_value = 0;
  defaultColors[3].m_value = 0;
  this = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (this,testCtx,"opsourcecontinued","OpSourceContinued instruction");
  passthruFragments_abi_cxx11_();
  opsource._M_dataplus._M_p = (pointer)&opsource.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&opsource,
             "%opsrcfile = OpString \"foo.vert\"\nOpSource GLSL 450 %opsrcfile \"void main(){}\"\n",
             "");
  tests[0].name._M_dataplus._M_p = (pointer)&tests[0].name.field_2;
  name = tests;
  std::__cxx11::string::_M_construct<char_const*>((string *)name,"empty","");
  tests[0].code._M_dataplus._M_p = (pointer)&tests[0].code.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&tests[0].code,opsource._M_dataplus._M_p,
             opsource._M_dataplus._M_p + opsource._M_string_length);
  std::__cxx11::string::append((char *)&tests[0].code);
  tests[1].name._M_dataplus._M_p = (pointer)&tests[1].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(tests + 1),"short","");
  tests[1].code._M_dataplus._M_p = (pointer)&tests[1].code.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&tests[1].code,opsource._M_dataplus._M_p,
             opsource._M_dataplus._M_p + opsource._M_string_length);
  std::__cxx11::string::append((char *)&tests[1].code);
  tests[2].name._M_dataplus._M_p = (pointer)&tests[2].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(tests + 2),"multiple","");
  tests[2].code._M_dataplus._M_p = (pointer)&tests[2].code.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&tests[2].code,opsource._M_dataplus._M_p,
             opsource._M_dataplus._M_p + opsource._M_string_length);
  std::__cxx11::string::append((char *)&tests[2].code);
  tests[3].name._M_dataplus._M_p = (pointer)&tests[3].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(tests + 3),"long","");
  paVar2 = &__str.field_2;
  __str._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__str,opsource._M_dataplus._M_p,
             opsource._M_dataplus._M_p + opsource._M_string_length);
  std::__cxx11::string::append((char *)&__str);
  (anonymous_namespace)::makeLongUTF8String_abi_cxx11_
            (&local_198,(_anonymous_namespace_ *)0xfffd,num4ByteChars);
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar2) {
    uVar8 = __str.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_198._M_string_length + __str._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      uVar8 = local_198.field_2._M_allocated_capacity;
    }
    if (local_198._M_string_length + __str._M_string_length <= (ulong)uVar8) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_198,0,(char *)0x0,(ulong)__str._M_dataplus._M_p);
      goto LAB_00521448;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&__str,(ulong)local_198._M_dataplus._M_p);
LAB_00521448:
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  puVar1 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1) {
    local_208.field_2._M_allocated_capacity = *puVar1;
    local_208.field_2._8_8_ = puVar4[3];
  }
  else {
    local_208.field_2._M_allocated_capacity = *puVar1;
    local_208._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_208._M_string_length = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_208);
  paVar10 = &tests[3].code.field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar7) {
    tests[3].code.field_2._0_8_ = *psVar7;
    tests[3].code.field_2._8_8_ = plVar5[3];
    tests[3].code._M_dataplus._M_p = (pointer)paVar10;
  }
  else {
    tests[3].code.field_2._0_8_ = *psVar7;
    tests[3].code._M_dataplus._M_p = (pointer)*plVar5;
  }
  tests[3].code._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  paVar3 = &local_208.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar3) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  getDefaultColors(&defaultColors);
  lVar9 = 4;
  do {
    local_208._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"debug","");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&fragments,&local_208);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar3) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    local_208._M_string_length = 0;
    local_208.field_2._M_allocated_capacity =
         local_208.field_2._M_allocated_capacity & 0xffffffffffffff00;
    __str.field_2._M_allocated_capacity = 0;
    __str._M_dataplus._M_p = (pointer)0x0;
    __str._M_string_length = 0;
    local_208._M_dataplus._M_p = (pointer)paVar3;
    createTestsForAllStages
              (&name->name,&defaultColors,&defaultColors,&fragments,
               (vector<int,_std::allocator<int>_> *)&__str,this,QP_TEST_RESULT_FAIL,&local_208);
    if (__str._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(__str._M_dataplus._M_p,
                      __str.field_2._M_allocated_capacity - (long)__str._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar3) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    name = name + 1;
    lVar9 = lVar9 + -1;
  } while (lVar9 != 0);
  lVar9 = -0x100;
  do {
    plVar5 = (long *)(((string *)(paVar10 + -1))->_M_dataplus)._M_p;
    if (paVar10 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar5) {
      operator_delete(plVar5,paVar10->_M_allocated_capacity + 1);
    }
    if (paVar10 + -2 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)paVar10[-3]._M_allocated_capacity) {
      operator_delete((long *)paVar10[-3]._M_allocated_capacity,
                      paVar10[-2]._M_allocated_capacity + 1);
    }
    paVar10 = paVar10 + -4;
    lVar9 = lVar9 + 0x40;
  } while (lVar9 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)opsource._M_dataplus._M_p != &opsource.field_2) {
    operator_delete(opsource._M_dataplus._M_p,opsource.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&fragments._M_t);
  return this;
}

Assistant:

tcu::TestCaseGroup* createOpSourceContinuedTests (tcu::TestContext& testCtx)
{
	struct NameCodePair { string name, code; };
	RGBA								defaultColors[4];
	de::MovePtr<tcu::TestCaseGroup>		opSourceTests		(new tcu::TestCaseGroup(testCtx, "opsourcecontinued", "OpSourceContinued instruction"));
	map<string, string>					fragments			= passthruFragments();
	const std::string					opsource			= "%opsrcfile = OpString \"foo.vert\"\nOpSource GLSL 450 %opsrcfile \"void main(){}\"\n";
	const NameCodePair					tests[]				=
	{
		{"empty", opsource + "OpSourceContinued \"\""},
		{"short", opsource + "OpSourceContinued \"abcde\""},
		{"multiple", opsource + "OpSourceContinued \"abcde\"\nOpSourceContinued \"fghij\""},
		// Longest possible source string: SPIR-V limits instructions to 65535
		// words, of which the first one is OpSourceContinued/length; the rest
		// will contain 65533 UTF8 characters (one word each) plus one last word
		// containing 3 ASCII characters and \0.
		{"long", opsource + "OpSourceContinued \"" + makeLongUTF8String(65533) + "ccc\""}
	};

	getDefaultColors(defaultColors);
	for (size_t testNdx = 0; testNdx < sizeof(tests) / sizeof(NameCodePair); ++testNdx)
	{
		fragments["debug"] = tests[testNdx].code;
		createTestsForAllStages(tests[testNdx].name, defaultColors, defaultColors, fragments, opSourceTests.get());
	}

	return opSourceTests.release();
}